

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O1

void __thiscall
chrono::ChContactContainerNSC::IntStateGatherReactions
          (ChContactContainerNSC *this,uint off_L,ChVectorDynamic<> *L)

{
  _List_node_base *p_Var1;
  int iVar2;
  
  iVar2 = 0;
  for (p_Var1 = (this->contactlist_6_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_6_6; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_6_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_6_3; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_3_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_3_3; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_333_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_333_3; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_333_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_333_6; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_333_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_333_333; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_666_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_666_3; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_666_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_666_6; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_666_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_666_333; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  for (p_Var1 = (this->contactlist_666_666).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->contactlist_666_666; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,off_L + iVar2,L);
    iVar2 = iVar2 + 3;
  }
  p_Var1 = (this->contactlist_6_6_rolling).
           super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->contactlist_6_6_rolling) {
    iVar2 = iVar2 + off_L;
    do {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))(p_Var1[1]._M_next,iVar2,L);
      p_Var1 = p_Var1->_M_next;
      iVar2 = iVar2 + 6;
    } while (p_Var1 != (_List_node_base *)&this->contactlist_6_6_rolling);
  }
  return;
}

Assistant:

void ChContactContainerNSC::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    unsigned int coffset = 0;
    _IntStateGatherReactions(coffset, contactlist_6_6, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_6_3, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_3_3, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_333_3, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_333_6, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_333_333, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_666_3, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_666_6, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_666_333, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_666_666, off_L, L, 3);
    _IntStateGatherReactions(coffset, contactlist_6_6_rolling, off_L, L, 6);
}